

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int js_parse_class_default_ctor(JSParseState *s,BOOL has_super,JSFunctionDef **pfd)

{
  int iVar1;
  BOOL BVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint8_t *puVar8;
  char *pcVar9;
  JSFunctionDef **in_stack_ffffffffffffffb0;
  
  pcVar9 = "(){super(...arguments);}";
  if (has_super == 0) {
    pcVar9 = "(){}";
  }
  iVar1 = s->last_line_num;
  uVar7 = (s->token).line_num;
  puVar3 = (s->token).ptr;
  BVar2 = s->got_lf;
  puVar4 = s->buf_end;
  s->buf_ptr = (uint8_t *)pcVar9;
  puVar8 = (uint8_t *)pcVar9 + 0x18;
  if (has_super == 0) {
    puVar8 = (uint8_t *)pcVar9 + 4;
  }
  s->buf_end = puVar8;
  iVar5 = next_token(s);
  uVar6 = 0xffffffff;
  if (iVar5 == 0) {
    uVar6 = js_parse_function_decl2
                      (s,JS_PARSE_FUNC_DERIVED_CLASS_CONSTRUCTOR - (has_super == 0),JS_FUNC_NORMAL,
                       (JSAtom)pcVar9,(uint8_t *)(ulong)uVar7,0,(JSParseExportEnum)pfd,
                       in_stack_ffffffffffffffb0);
  }
  s->buf_end = puVar4;
  (s->token).line_num = iVar1;
  s->line_num = uVar7;
  s->buf_ptr = puVar3;
  s->got_lf = BVar2;
  uVar7 = next_token(s);
  return uVar7 | uVar6;
}

Assistant:

static __exception int js_parse_class_default_ctor(JSParseState *s,
                                                   BOOL has_super,
                                                   JSFunctionDef **pfd)
{
    JSParsePos pos;
    const char *str;
    int ret, line_num;
    JSParseFunctionEnum func_type;
    const uint8_t *saved_buf_end;
    
    js_parse_get_pos(s, &pos);
    if (has_super) {
        /* spec change: no argument evaluation */
        str = "(){super(...arguments);}";
        func_type = JS_PARSE_FUNC_DERIVED_CLASS_CONSTRUCTOR;
    } else {
        str = "(){}";
        func_type = JS_PARSE_FUNC_CLASS_CONSTRUCTOR;
    }
    line_num = s->token.line_num;
    saved_buf_end = s->buf_end;
    s->buf_ptr = (uint8_t *)str;
    s->buf_end = (uint8_t *)(str + strlen(str));
    ret = next_token(s);
    if (!ret) {
        ret = js_parse_function_decl2(s, func_type, JS_FUNC_NORMAL,
                                      JS_ATOM_NULL, (uint8_t *)str,
                                      line_num, JS_PARSE_EXPORT_NONE, pfd);
    }
    s->buf_end = saved_buf_end;
    ret |= js_parse_seek_token(s, &pos);
    return ret;
}